

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix44<float> * __thiscall Imath_3_2::Matrix44<float>::inverse(Matrix44<float> *this,bool singExc)

{
  invalid_argument *this_00;
  byte in_DL;
  float *in_RSI;
  Matrix44<float> *in_RDI;
  float a;
  float fVar1;
  float fVar2;
  float fVar3;
  int j_1;
  int i_1;
  float mr;
  int j;
  int i;
  float r;
  Matrix44<float> s;
  int local_6c;
  int local_68;
  int local_60;
  int local_5c;
  Matrix44<float> local_54;
  byte local_11;
  
  local_11 = in_DL & 1;
  if ((((in_RSI[3] != 0.0) || (in_RSI[7] != 0.0)) || (in_RSI[0xb] != 0.0)) ||
     (((NAN(in_RSI[0xb]) || (in_RSI[0xf] != 1.0)) || (NAN(in_RSI[0xf]))))) {
    gjInverse(in_RDI,SUB81((ulong)in_RSI >> 0x38,0));
  }
  else {
    Matrix44(&local_54,in_RSI[5] * in_RSI[10] + -(in_RSI[9] * in_RSI[6]),
             in_RSI[9] * in_RSI[2] + -(in_RSI[1] * in_RSI[10]),
             in_RSI[1] * in_RSI[6] + -(in_RSI[5] * in_RSI[2]),0.0,
             in_RSI[8] * in_RSI[6] + -(in_RSI[4] * in_RSI[10]),
             *in_RSI * in_RSI[10] + -(in_RSI[8] * in_RSI[2]),
             in_RSI[4] * in_RSI[2] + -(*in_RSI * in_RSI[6]),0.0,
             in_RSI[4] * in_RSI[9] + -(in_RSI[8] * in_RSI[5]),
             in_RSI[8] * in_RSI[1] + -(*in_RSI * in_RSI[9]),
             *in_RSI * in_RSI[5] + -(in_RSI[4] * in_RSI[1]),0.0,0.0,0.0,0.0,1.0);
    a = in_RSI[2] * local_54.x[2][0] + *in_RSI * local_54.x[0][0] + in_RSI[1] * local_54.x[1][0];
    fVar1 = abs<float>(a);
    if (fVar1 < 1.0) {
      fVar1 = abs<float>(a);
      fVar2 = std::numeric_limits<float>::min();
      for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
        for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
          fVar3 = abs<float>(local_54.x[local_68][local_6c]);
          if (fVar1 / fVar2 <= fVar3) {
            if ((local_11 & 1) == 0) {
              Matrix44(in_RDI);
              return in_RDI;
            }
            this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
            __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          local_54.x[local_68][local_6c] = local_54.x[local_68][local_6c] / a;
        }
      }
    }
    else {
      for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
        for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
          local_54.x[local_5c][local_60] = local_54.x[local_5c][local_60] / a;
        }
      }
    }
    local_54.x[3][0] =
         -in_RSI[0xe] * local_54.x[2][0] +
         -in_RSI[0xc] * local_54.x[0][0] + -(in_RSI[0xd] * local_54.x[1][0]);
    local_54.x[3][1] =
         -in_RSI[0xe] * local_54.x[2][1] +
         -in_RSI[0xc] * local_54.x[0][1] + -(in_RSI[0xd] * local_54.x[1][1]);
    local_54.x[3][2] =
         -in_RSI[0xe] * local_54.x[2][2] +
         -in_RSI[0xc] * local_54.x[0][2] + -(in_RSI[0xd] * local_54.x[1][2]);
    Matrix44(in_RDI,&local_54);
  }
  return in_RDI;
}

Assistant:

IMATH_CONSTEXPR14 inline Matrix44<T>
Matrix44<T>::inverse (bool singExc) const
{
    if (x[0][3] != 0 || x[1][3] != 0 || x[2][3] != 0 || x[3][3] != 1)
        return gjInverse (singExc);

    Matrix44 s (
        x[1][1] * x[2][2] - x[2][1] * x[1][2],
        x[2][1] * x[0][2] - x[0][1] * x[2][2],
        x[0][1] * x[1][2] - x[1][1] * x[0][2],
        0,

        x[2][0] * x[1][2] - x[1][0] * x[2][2],
        x[0][0] * x[2][2] - x[2][0] * x[0][2],
        x[1][0] * x[0][2] - x[0][0] * x[1][2],
        0,

        x[1][0] * x[2][1] - x[2][0] * x[1][1],
        x[2][0] * x[0][1] - x[0][0] * x[2][1],
        x[0][0] * x[1][1] - x[1][0] * x[0][1],
        0,

        0,
        0,
        0,
        1);

    T r = x[0][0] * s.x[0][0] + x[0][1] * s.x[1][0] + x[0][2] * s.x[2][0];

    if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
    {
        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                s.x[i][j] /= r;
            }
        }
    }
    else
    {
        T mr =
            IMATH_INTERNAL_NAMESPACE::abs (r) / std::numeric_limits<T>::min ();

        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                if (mr > IMATH_INTERNAL_NAMESPACE::abs (s.x[i][j]))
                {
                    s.x[i][j] /= r;
                }
                else
                {
                    if (singExc)
                        throw std::invalid_argument (
                            "Cannot invert singular matrix.");

                    return Matrix44 ();
                }
            }
        }
    }

    s.x[3][0] =
        -x[3][0] * s.x[0][0] - x[3][1] * s.x[1][0] - x[3][2] * s.x[2][0];
    s.x[3][1] =
        -x[3][0] * s.x[0][1] - x[3][1] * s.x[1][1] - x[3][2] * s.x[2][1];
    s.x[3][2] =
        -x[3][0] * s.x[0][2] - x[3][1] * s.x[1][2] - x[3][2] * s.x[2][2];

    return s;
}